

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManTestStruct(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vLeaves;
  int *piVar3;
  Vec_Int_t *pVVar4;
  word *pTruth;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  int LutNDecomp [8];
  int LutCount [8];
  int local_78 [18];
  
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  vLeaves = (Vec_Int_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  piVar3 = (int *)malloc(400);
  vLeaves->pArray = piVar3;
  Gia_ObjComputeTruthTableStart(p,7);
  uVar8 = 0;
  uVar11 = 0;
  uVar2 = 0;
  uVar13 = 0;
  uVar9 = 0;
  if (1 < p->nObjs) {
    lVar12 = 1;
    do {
      pVVar4 = p->vMapping;
      if (pVVar4->nSize <= lVar12) {
LAB_00215c94:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar8 = pVVar4->pArray[lVar12];
      if ((ulong)uVar8 != 0) {
        if (((int)uVar8 < 0) || ((uint)pVVar4->nSize <= uVar8)) goto LAB_00215c94;
        uVar8 = pVVar4->pArray[uVar8];
        lVar14 = (long)(int)uVar8;
        if (7 < lVar14) {
          __assert_fail("nFanins <= 7",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x9cd,"void Gia_ManTestStruct(Gia_Man_t *)");
        }
        uVar5 = 5;
        if (5 < (int)uVar8) {
          uVar5 = (ulong)uVar8;
        }
        local_78[uVar5 + 8] = local_78[uVar5 + 8] + 1;
        if (5 < (int)uVar8) {
          vLeaves->nSize = 0;
          lVar6 = (long)pVVar4->nSize;
          if (lVar6 <= lVar12) goto LAB_00215c94;
          lVar10 = 0;
          while( true ) {
            piVar3 = pVVar4->pArray;
            lVar7 = (long)piVar3[lVar12];
            if ((lVar7 < 0) || ((uint)lVar6 <= (uint)piVar3[lVar12])) goto LAB_00215c94;
            if (piVar3[lVar7] <= lVar10) break;
            Vec_IntPush(vLeaves,piVar3[lVar7 + lVar10 + 1]);
            lVar10 = lVar10 + 1;
            pVVar4 = p->vMapping;
            lVar6 = (long)pVVar4->nSize;
            if (lVar6 <= lVar12) goto LAB_00215c94;
          }
          if (p->nObjs <= lVar12) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pTruth = Gia_ObjComputeTruthTableCut(p,p->pObjs + lVar12,vLeaves);
          iVar1 = If_CutPerformCheck07((If_Man_t *)0x0,(uint *)pTruth,7,uVar8,(char *)0x0);
          if ((iVar1 != 1) && (iVar1 = local_78[lVar14], local_78[lVar14] = iVar1 + 1, iVar1 < 10))
          {
            Kit_DsdPrintFromTruth((uint *)pTruth,uVar8);
            putchar(10);
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < p->nObjs);
    uVar8 = local_78[0xd];
    uVar11 = local_78[0xe];
    uVar2 = local_78[7];
    uVar13 = local_78[0xf];
    uVar9 = local_78[6];
  }
  Gia_ObjComputeTruthTableStop(p);
  printf("LUT5 = %d    ",(ulong)uVar8);
  uVar8 = 1;
  if (1 < (int)uVar11) {
    uVar8 = uVar11;
  }
  printf("LUT6 = %d  NonDec = %d (%.2f %%)    ",
         SUB84(((double)(int)uVar9 * 100.0) / (double)(int)uVar8,0),(ulong)uVar11,(ulong)uVar9);
  uVar8 = 1;
  if (1 < (int)uVar13) {
    uVar8 = uVar13;
  }
  printf("LUT7 = %d  NonDec = %d (%.2f %%)    ",
         SUB84(((double)(int)uVar2 * 100.0) / (double)(int)uVar8,0),(ulong)uVar13,(ulong)uVar2);
  putchar(10);
  return;
}

Assistant:

void Gia_ManTestStruct( Gia_Man_t * p )
{
    int nCutMax = 7;
    int LutCount[8] = {0}, LutNDecomp[8] = {0};
    int i, k, iFan, nFanins, Status;
    Vec_Int_t * vLeaves;
    word * pTruth;

    vLeaves = Vec_IntAlloc( 100 );
    Gia_ObjComputeTruthTableStart( p, nCutMax );
    Gia_ManForEachLut( p, i )
    {
        nFanins = Gia_ObjLutSize(p, i);
        assert( nFanins <= 7 );
        LutCount[Abc_MaxInt(nFanins, 5)]++;
        if ( nFanins <= 5 )
            continue;
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( p, i, iFan, k )
            Vec_IntPush( vLeaves, iFan );
        pTruth = Gia_ObjComputeTruthTableCut( p, Gia_ManObj(p, i), vLeaves );
        // check if it is decomposable
        Status = If_CutPerformCheck07( NULL, (unsigned *)pTruth, 7, nFanins, NULL );
        if ( Status == 1 )
            continue;
        LutNDecomp[nFanins]++;
        if ( LutNDecomp[nFanins] > 10 )
            continue;
        Kit_DsdPrintFromTruth( (unsigned *)pTruth, nFanins ); printf( "\n" );
    }
    Gia_ObjComputeTruthTableStop( p );

    printf( "LUT5 = %d    ", LutCount[5] );
    printf( "LUT6 = %d  NonDec = %d (%.2f %%)    ", LutCount[6], LutNDecomp[6], 100.0 * LutNDecomp[6]/Abc_MaxInt(LutCount[6], 1) );
    printf( "LUT7 = %d  NonDec = %d (%.2f %%)    ", LutCount[7], LutNDecomp[7], 100.0 * LutNDecomp[7]/Abc_MaxInt(LutCount[7], 1) );
    printf( "\n" );
}